

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

void __thiscall libcellml::Logger::LoggerImpl::removeError(LoggerImpl *this,size_t index)

{
  pointer puVar1;
  pointer puVar2;
  pointer __src;
  
  puVar1 = (this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->mErrors).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    std::
    vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>::
    _M_erase(&this->mIssues,
             (this->mIssues).
             super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
             ._M_impl.super__Vector_impl_data._M_start + puVar1[index]);
    puVar1 = (this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    __src = puVar1 + index + 1;
    if (__src != puVar2) {
      memmove(puVar1 + index,__src,(long)puVar2 - (long)__src);
      puVar2 = (this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    (this->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2 + -1;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",index);
}

Assistant:

void Logger::LoggerImpl::removeError(size_t index)
{
    mIssues.erase(mIssues.begin() + ptrdiff_t(mErrors.at(index)));
    mErrors.erase(mErrors.begin() + ptrdiff_t(index));
}